

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testchar.c
# Opt level: O0

int testDocumentRanges(void)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  xmlParserCtxtPtr ctxt_00;
  size_t sVar9;
  int test_ret;
  char *data;
  xmlParserCtxtPtr ctxt;
  
  ctxt_00 = (xmlParserCtxtPtr)xmlNewParserCtxt();
  if (ctxt_00 == (xmlParserCtxtPtr)0x0) {
    fprintf(_stderr,"Failed to allocate parser context\n");
    ctxt._4_4_ = 1;
  }
  else {
    printf("testing 1 byte char in document: 1");
    fflush(_stdout);
    builtin_strncpy(document1 + 5,"    ",4);
    sVar9 = strlen(document1);
    iVar1 = testDocumentRangeByte1(ctxt_00,document1,(int)sVar9,document1 + 5,-1,-1);
    printf(" 2");
    fflush(_stdout);
    builtin_strncpy(document1 + 5,"    ",4);
    sVar9 = strlen(document1);
    iVar2 = testDocumentRangeByte1(ctxt_00,document1,(int)sVar9,document1 + 8,-1,-1);
    printf(" 3");
    fflush(_stdout);
    builtin_strncpy(document2 + 10,"    ",4);
    sVar9 = strlen(document2);
    iVar3 = testDocumentRangeByte1(ctxt_00,document2,(int)sVar9,document2 + 10,0x27,-1);
    printf(" 4");
    fflush(_stdout);
    builtin_strncpy(document2 + 10,"    ",4);
    sVar9 = strlen(document2);
    iVar4 = testDocumentRangeByte1(ctxt_00,document2,(int)sVar9,document2 + 0xd,0x27,-1);
    printf(" done\n");
    printf("testing 2 byte char in document: 1");
    fflush(_stdout);
    builtin_strncpy(document1 + 5,"    ",4);
    sVar9 = strlen(document1);
    iVar5 = testDocumentRangeByte2(ctxt_00,document1,(int)sVar9,document1 + 5);
    printf(" 2");
    fflush(_stdout);
    builtin_strncpy(document1 + 5,"    ",4);
    sVar9 = strlen(document1);
    iVar6 = testDocumentRangeByte2(ctxt_00,document1,(int)sVar9,document1 + 7);
    printf(" 3");
    fflush(_stdout);
    builtin_strncpy(document2 + 10,"    ",4);
    sVar9 = strlen(document2);
    iVar7 = testDocumentRangeByte2(ctxt_00,document2,(int)sVar9,document2 + 10);
    printf(" 4");
    fflush(_stdout);
    builtin_strncpy(document2 + 10,"    ",4);
    sVar9 = strlen(document2);
    iVar8 = testDocumentRangeByte2(ctxt_00,document2,(int)sVar9,document2 + 0xc);
    ctxt._4_4_ = iVar8 + iVar7 + iVar6 + iVar5 + iVar4 + iVar3 + iVar2 + iVar1;
    printf(" done\n");
    xmlFreeParserCtxt(ctxt_00);
  }
  return ctxt._4_4_;
}

Assistant:

static int testDocumentRanges(void) {
    xmlParserCtxtPtr ctxt;
    char *data;
    int test_ret = 0;

    /*
     * Set up a parsing context using the first document as
     * the current input source.
     */
    ctxt = xmlNewParserCtxt();
    if (ctxt == NULL) {
        fprintf(stderr, "Failed to allocate parser context\n");
	return(1);
    }

    printf("testing 1 byte char in document: 1");
    fflush(stdout);
    data = &document1[5];
    data[0] = ' ';
    data[1] = ' ';
    data[2] = ' ';
    data[3] = ' ';
    /* test 1 byte injection at beginning of area */
    test_ret += testDocumentRangeByte1(ctxt, &document1[0], strlen(document1),
                           data, -1, -1);
    printf(" 2");
    fflush(stdout);
    data[0] = ' ';
    data[1] = ' ';
    data[2] = ' ';
    data[3] = ' ';
    /* test 1 byte injection at end of area */
    test_ret += testDocumentRangeByte1(ctxt, &document1[0], strlen(document1),
                           data + 3, -1, -1);

    printf(" 3");
    fflush(stdout);
    data = &document2[10];
    data[0] = ' ';
    data[1] = ' ';
    data[2] = ' ';
    data[3] = ' ';
    /* test 1 byte injection at beginning of area */
    test_ret += testDocumentRangeByte1(ctxt, &document2[0], strlen(document2),
                           data, '\'', -1);
    printf(" 4");
    fflush(stdout);
    data[0] = ' ';
    data[1] = ' ';
    data[2] = ' ';
    data[3] = ' ';
    /* test 1 byte injection at end of area */
    test_ret += testDocumentRangeByte1(ctxt, &document2[0], strlen(document2),
                           data + 3, '\'', -1);
    printf(" done\n");

    printf("testing 2 byte char in document: 1");
    fflush(stdout);
    data = &document1[5];
    data[0] = ' ';
    data[1] = ' ';
    data[2] = ' ';
    data[3] = ' ';
    /* test 2 byte injection at beginning of area */
    test_ret += testDocumentRangeByte2(ctxt, &document1[0], strlen(document1),
                           data);
    printf(" 2");
    fflush(stdout);
    data[0] = ' ';
    data[1] = ' ';
    data[2] = ' ';
    data[3] = ' ';
    /* test 2 byte injection at end of area */
    test_ret += testDocumentRangeByte2(ctxt, &document1[0], strlen(document1),
                           data + 2);

    printf(" 3");
    fflush(stdout);
    data = &document2[10];
    data[0] = ' ';
    data[1] = ' ';
    data[2] = ' ';
    data[3] = ' ';
    /* test 2 byte injection at beginning of area */
    test_ret += testDocumentRangeByte2(ctxt, &document2[0], strlen(document2),
                           data);
    printf(" 4");
    fflush(stdout);
    data[0] = ' ';
    data[1] = ' ';
    data[2] = ' ';
    data[3] = ' ';
    /* test 2 byte injection at end of area */
    test_ret += testDocumentRangeByte2(ctxt, &document2[0], strlen(document2),
                           data + 2);
    printf(" done\n");

    xmlFreeParserCtxt(ctxt);
    return(test_ret);
}